

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O1

bool __thiscall
lzham::raw_quasi_adaptive_huffman_data_model::update(raw_quasi_adaptive_huffman_data_model *this)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  unsigned_short *puVar4;
  uint16 *puVar5;
  uint8 *puVar6;
  decoder_tables *pTables;
  long lVar7;
  bool bVar8;
  undefined8 in_RAX;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  undefined8 uStack_20;
  undefined8 local_18;
  uint max_code_size;
  uint total_freq;
  
  uVar9 = this->m_total_count + this->m_update_cycle;
  if (0x7fff < uVar9) {
    uVar2 = this->m_total_syms;
    puVar4 = (this->m_sym_freq).m_p;
    do {
      if ((ulong)uVar2 == 0) {
        uVar9 = 0;
      }
      else {
        uVar10 = 0;
        uVar9 = 0;
        do {
          uVar11 = puVar4[uVar10] + 1 >> 1;
          uVar9 = uVar9 + uVar11;
          puVar4[uVar10] = (unsigned_short)uVar11;
          uVar10 = uVar10 + 1;
        } while (uVar2 != uVar10);
      }
    } while (0x7fff < uVar9);
  }
  this->m_total_count = uVar9;
  local_18 = in_RAX;
  if (this->m_use_polar_codes == true) {
    uStack_20 = 0x11c6b6;
    uVar9 = get_generate_polar_codes_table_size();
  }
  else {
    uStack_20 = 0x11c6bd;
    uVar9 = get_generate_huffman_codes_table_size();
  }
  lVar7 = -((ulong)uVar9 + 0xf & 0xfffffffffffffff0);
  uVar3 = this->m_total_syms;
  puVar5 = (this->m_sym_freq).m_p;
  puVar6 = (this->m_code_sizes).m_p;
  if (this->m_use_polar_codes == true) {
    *(undefined8 *)((long)&uStack_20 + lVar7) = 0x11c6ed;
    bVar8 = generate_polar_codes
                      ((void *)((long)&local_18 + lVar7),uVar3,puVar5,puVar6,(uint *)&local_18,
                       (uint *)((long)&local_18 + 4));
  }
  else {
    *(undefined8 *)((long)&uStack_20 + lVar7) = 0x11c6fc;
    bVar8 = generate_huffman_codes
                      ((void *)((long)&local_18 + lVar7),uVar3,puVar5,puVar6,(uint *)&local_18,
                       (uint *)((long)&local_18 + 4));
  }
  if ((bVar8 != false) && (local_18._4_4_ == this->m_total_count)) {
    if (0x10 < (uint)local_18) {
      uVar3 = this->m_total_syms;
      puVar6 = (this->m_code_sizes).m_p;
      *(undefined8 *)((long)&uStack_20 + lVar7) = 0x11c71f;
      bVar8 = prefix_coding::limit_max_code_size(uVar3,puVar6,0x10);
      if (!bVar8) {
        return false;
      }
    }
    uVar3 = this->m_total_syms;
    puVar6 = (this->m_code_sizes).m_p;
    if (this->m_encoding == true) {
      puVar5 = (this->m_codes).m_p;
      *(undefined8 *)((long)&uStack_20 + lVar7) = 0x11c739;
      bVar8 = prefix_coding::generate_codes(uVar3,puVar6,puVar5);
    }
    else {
      pTables = this->m_pDecode_tables;
      bVar1 = this->m_decoder_table_bits;
      *(undefined8 *)((long)&uStack_20 + lVar7) = 0x11c748;
      bVar8 = prefix_coding::generate_decoder_tables(uVar3,puVar6,pTables,(uint)bVar1);
    }
    if (bVar8 != false) {
      uVar9 = this->m_update_cycle * 2;
      if (this->m_fast_updating == false) {
        uVar9 = this->m_update_cycle * 5 >> 2;
      }
      if (this->m_max_cycle <= uVar9) {
        uVar9 = this->m_max_cycle;
      }
      this->m_update_cycle = uVar9;
      this->m_symbols_until_update = uVar9;
      return true;
    }
  }
  return false;
}

Assistant:

bool raw_quasi_adaptive_huffman_data_model::update()
   {
      LZHAM_ASSERT(!m_symbols_until_update);
      m_total_count += m_update_cycle;
      LZHAM_ASSERT(m_total_count <= 65535);

      while (m_total_count >= 32768)
         rescale();

      uint table_size = m_use_polar_codes ? get_generate_polar_codes_table_size() : get_generate_huffman_codes_table_size();
      void *pTables = alloca(table_size);

      uint max_code_size, total_freq;
      bool status;
      if (m_use_polar_codes)
         status = generate_polar_codes(pTables, m_total_syms, &m_sym_freq[0], &m_code_sizes[0], max_code_size, total_freq);
      else
         status = generate_huffman_codes(pTables, m_total_syms, &m_sym_freq[0], &m_code_sizes[0], max_code_size, total_freq);
      LZHAM_ASSERT(status);
      LZHAM_ASSERT(total_freq == m_total_count);
      if ((!status) || (total_freq != m_total_count))
         return false;

      if (max_code_size > prefix_coding::cMaxExpectedCodeSize)
      {
         bool status = prefix_coding::limit_max_code_size(m_total_syms, &m_code_sizes[0], prefix_coding::cMaxExpectedCodeSize);
         LZHAM_ASSERT(status);
         if (!status)
            return false;
      }

      if (m_encoding)
         status = prefix_coding::generate_codes(m_total_syms, &m_code_sizes[0], &m_codes[0]);
      else
         status = prefix_coding::generate_decoder_tables(m_total_syms, &m_code_sizes[0], m_pDecode_tables, m_decoder_table_bits);

      LZHAM_ASSERT(status);
      if (!status)
         return false;

      if (m_fast_updating)
         m_update_cycle = 2 * m_update_cycle;
      else
         m_update_cycle = (5 * m_update_cycle) >> 2;

      if (m_update_cycle > m_max_cycle)
         m_update_cycle = m_max_cycle;

      m_symbols_until_update = m_update_cycle;

      return true;
   }